

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

void Jf_ManProfileClasses(Jf_Man_t *p)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  int Costs [595];
  int Counts [595];
  uint local_12d8 [596];
  uint local_988 [598];
  
  memset(local_988,0,0x94c);
  memset(local_12d8,0,0x94c);
  printf("DSD classes that appear in more than %.1f %% of mapped nodes:\n",
         (double)p->pPars->nVerbLimit * 0.1);
  pGVar4 = p->pGia;
  iVar9 = pGVar4->nObjs;
  iVar10 = 0;
  iVar6 = 0;
  if (0 < (long)iVar9) {
    pGVar5 = pGVar4->pObjs;
    lVar11 = 0;
    iVar6 = 0;
    iVar10 = 0;
    pGVar12 = pGVar5;
    do {
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        iVar10 = 0;
        iVar6 = 0;
        break;
      }
      uVar8 = (uint)*(undefined8 *)pGVar12;
      if ((((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
          ((((int)uVar8 < 0 || ((uVar8 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar8 & 0x1fffffff) != ((uint)((ulong)*(undefined8 *)pGVar12 >> 0x20) & 0x1fffffff)))))
         && (pGVar4->pRefs[lVar11] != 0)) {
        if ((p->vCuts).nSize <= lVar11) {
LAB_0074fed9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (p->vCuts).pArray[lVar11];
        uVar8 = *(uint *)((long)(p->pMem).pPages[(int)uVar8 >> ((byte)(p->pMem).nPageSize & 0x1f)] +
                         (long)(int)(uVar8 & (p->pMem).uPageMask) * 8 + 4);
        if (0x4a5ff < uVar8) {
          __assert_fail("iFunc < 595",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                        ,0x13e,"void Jf_ManProfileClasses(Jf_Man_t *)");
        }
        uVar8 = uVar8 >> 9;
        if (p->pPars->fGenCnf != 0) {
          if (p->vCnfs->nSize <= (int)uVar8) goto LAB_0074fed9;
          iVar2 = *(int *)((long)p->vCnfs->pArray + (ulong)(uVar8 * 4));
          piVar1 = (int *)((long)local_12d8 + (ulong)(uVar8 * 4));
          *piVar1 = *piVar1 + iVar2;
          iVar6 = iVar6 + iVar2;
        }
        local_988[uVar8] = local_988[uVar8] + 1;
        iVar10 = iVar10 + 1;
      }
      lVar11 = lVar11 + 1;
      pGVar12 = pGVar12 + 1;
    } while (iVar9 != lVar11);
  }
  if (iVar6 < 2) {
    iVar6 = 1;
  }
  iVar9 = 1;
  if (1 < iVar10) {
    iVar9 = iVar10;
  }
  uVar14 = 0;
  uVar8 = 0;
  uVar13 = 0;
  do {
    uVar3 = local_988[uVar14];
    if ((uVar3 == 0) ||
       (dVar15 = ((double)(int)uVar3 * 100.0) / (double)iVar9,
       dVar15 < (double)p->pPars->nVerbLimit * 0.1)) {
      uVar13 = uVar13 + uVar3;
      uVar8 = uVar8 + local_12d8[uVar14];
    }
    else {
      printf("%5d  :  ",uVar14 & 0xffffffff);
      pcVar7 = Sdm_ManReadDsdStr(p->pDsd,(int)uVar14);
      printf("%-20s   ",pcVar7);
      printf("%8d  ",(ulong)uVar3);
      printf("%5.1f %%   ",dVar15);
      uVar3 = local_12d8[uVar14];
      printf("%8d  ",(ulong)uVar3);
      printf("%5.1f %%",((double)(int)uVar3 * 100.0) / (double)iVar6);
      putchar(10);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x253);
  printf("Other  :  ");
  printf("%-20s   ","");
  printf("%8d  ",(ulong)uVar13);
  printf("%5.1f %%   ",((double)(int)uVar13 * 100.0) / (double)iVar9);
  printf("%8d  ",(ulong)uVar8);
  printf("%5.1f %%",((double)(int)uVar8 * 100.0) / (double)iVar6);
  putchar(10);
  return;
}

Assistant:

void Jf_ManProfileClasses( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int Counts[595] = {0}, Costs[595] = {0};
    int i, iFunc, Total = 0, CostTotal = 0, Other = 0, CostOther = 0;
    printf( "DSD classes that appear in more than %.1f %% of mapped nodes:\n", 0.1 * p->pPars->nVerbLimit );
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( !Gia_ObjIsBuf(pObj) && Gia_ObjRefNumId(p->pGia, i) )
        {
            iFunc = Jf_CutFuncClass( Jf_ObjCutBest(p, i) );
            assert( iFunc < 595 );
            if ( p->pPars->fGenCnf )
            {
                Costs[iFunc] += Jf_CutCnfSizeF(p, iFunc);
                CostTotal += Jf_CutCnfSizeF(p, iFunc);
            }
            Counts[iFunc]++;
            Total++;
        }
    CostTotal = Abc_MaxInt(CostTotal, 1);
    Total = Abc_MaxInt(Total, 1);
    for ( i = 0; i < 595; i++ )
        if ( Counts[i] && 100.0 * Counts[i] / Total >= 0.1 * p->pPars->nVerbLimit )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", Sdm_ManReadDsdStr(p->pDsd, i) );
            printf( "%8d  ",    Counts[i] );
            printf( "%5.1f %%   ", 100.0 * Counts[i] / Total );
            printf( "%8d  ",    Costs[i] );
            printf( "%5.1f %%", 100.0 * Costs[i] / CostTotal );
            printf( "\n" );
        }
        else
        {
            Other += Counts[i];
            CostOther += Costs[i];
        }
    printf( "Other  :  " );
    printf( "%-20s   ",   "" );
    printf( "%8d  ",    Other );
    printf( "%5.1f %%   ", 100.0 * Other / Total );
    printf( "%8d  ",    CostOther );
    printf( "%5.1f %%", 100.0 * CostOther / CostTotal );
    printf( "\n" );
}